

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

void __thiscall
cmsys::Encoding::CommandLineArguments::CommandLineArguments
          (CommandLineArguments *this,int ac,wchar_t **av)

{
  char *pcVar1;
  reference ppcVar2;
  int local_30;
  int i;
  wchar_t **av_local;
  int ac_local;
  CommandLineArguments *this_local;
  
  std::vector<char_*,_std::allocator<char_*>_>::vector(&this->argv_);
  std::vector<char_*,_std::allocator<char_*>_>::resize(&this->argv_,(long)(ac + 1));
  for (local_30 = 0; local_30 < ac; local_30 = local_30 + 1) {
    pcVar1 = cmsysEncoding_DupToNarrow(av[local_30]);
    ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this->argv_,(long)local_30);
    *ppcVar2 = pcVar1;
  }
  ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this->argv_,(long)ac);
  *ppcVar2 = (value_type)0x0;
  return;
}

Assistant:

Encoding::CommandLineArguments::CommandLineArguments(int ac,
                                                     wchar_t const* const* av)
{
  this->argv_.resize(ac + 1);
  for (int i = 0; i < ac; i++) {
    this->argv_[i] = kwsysEncoding_DupToNarrow(av[i]);
  }
  this->argv_[ac] = nullptr;
}